

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QUrl>::insert
          (QMovableArrayOps<QUrl> *this,qsizetype i,qsizetype n,parameter_type t)

{
  uint uVar1;
  QUrl *pQVar2;
  QUrl *in_RCX;
  QArrayDataPointer<QUrl> *in_RDX;
  long in_RSI;
  QArrayDataPointer<QUrl> *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  GrowthPosition pos;
  bool growsAtBegin;
  QUrl copy;
  qsizetype in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar4;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar5;
  QArrayDataPointer<QUrl> *pQVar6;
  Inserter local_38;
  QUrl local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&local_10,in_RCX);
  bVar3 = in_RDI->size != 0;
  uVar4 = bVar3 && in_RSI == 0;
  uVar5 = CONCAT13(uVar4,(int3)in_stack_ffffffffffffffa4);
  uVar1 = (uint)(bVar3 && in_RSI == 0);
  QArrayDataPointer<QUrl>::detachAndGrow
            (in_RDX,(GrowthPosition)((ulong)in_RCX >> 0x20),CONCAT44(uVar5,uVar1),
             (QUrl **)CONCAT17(uVar4,in_stack_ffffffffffffff98),in_RDI);
  if ((uVar5 & 0x1000000) == 0) {
    Inserter::Inserter((Inserter *)CONCAT44(uVar5,uVar1),
                       (QArrayDataPointer<QUrl> *)CONCAT17(uVar4,in_stack_ffffffffffffff98),
                       (qsizetype)in_RDI,in_stack_ffffffffffffff88);
    Inserter::insertFill
              ((Inserter *)CONCAT44(uVar5,uVar1),(QUrl *)CONCAT17(uVar4,in_stack_ffffffffffffff98),
               (qsizetype)in_RDI);
    Inserter::~Inserter(&local_38);
  }
  else {
    while (pQVar6 = (QArrayDataPointer<QUrl> *)((long)&in_RDX[-1].size + 7),
          in_RDX != (QArrayDataPointer<QUrl> *)0x0) {
      pQVar2 = QArrayDataPointer<QUrl>::begin((QArrayDataPointer<QUrl> *)0x3c80c2);
      QUrl::QUrl(pQVar2 + -1,(QUrl *)&local_10);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      in_RDX = pQVar6;
    }
  }
  QUrl::~QUrl(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }